

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
enterNode(FastGeneralizationsIterator *this,Node **curr)

{
  ulong uVar1;
  NodeAlgorithm elem;
  int iVar2;
  Node *pNVar3;
  undefined4 extraout_var;
  Node *pNVar4;
  Node *pNVar5;
  TermList *pTVar6;
  long *plVar7;
  uint uVar8;
  TermList *elem_00;
  long *elem_01;
  bool bVar9;
  Top TVar10;
  TermList binding;
  
  pNVar4 = *curr;
  elem = (*pNVar4->_vptr_Node[5])();
  uVar8 = *(uint *)&pNVar4[1]._vptr_Node;
  binding._content = (this->_subst)._specVars._array[uVar8]._content;
  *curr = (Node *)0x0;
  elem_00 = &pNVar4[1]._term;
  if (elem != UNSORTED_LIST) {
    plVar7 = *(long **)(elem_00->_content + 8);
    if ((binding._content & 3) == 0) {
      TVar10 = Kernel::TermList::top(&binding);
      iVar2 = (*pNVar4->_vptr_Node[10])
                        (pNVar4,TVar10._inner._inner._0_8_,
                         (ulong)(TVar10._inner._inner._8_4_ & 0xff),0);
      if ((long *)CONCAT44(extraout_var,iVar2) == (long *)0x0) {
        pNVar3 = *curr;
      }
      else {
        pNVar3 = *(Node **)CONCAT44(extraout_var,iVar2);
        *curr = pNVar3;
      }
      if (pNVar3 == (Node *)0x0) goto LAB_002acbe8;
      bVar9 = false;
LAB_002accec:
      if (plVar7 != (long *)0x0) {
        uVar8 = (uint)*(undefined8 *)(*plVar7 + 8);
        goto LAB_002accf9;
      }
      elem_01 = (long *)0x0;
LAB_002acd0a:
      Lib::Stack<unsigned_int>::push(&this->_specVarNumbers,*(uint *)&pNVar4[1]._vptr_Node);
    }
    else {
LAB_002acbe8:
      pNVar3 = (Node *)*plVar7;
      uVar1 = (pNVar3->_term)._content;
      uVar8 = (uint)uVar1;
      bVar9 = true;
      if ((uVar1 & 1) != 0) {
        *curr = pNVar3;
        plVar7 = (long *)plVar7[1];
        bVar9 = pNVar3 == (Node *)0x0;
        goto LAB_002accec;
      }
LAB_002accf9:
      elem_01 = (long *)(ulong)(uVar8 & 3);
      if ((uVar8 & 3) != 0) {
        elem_01 = plVar7;
      }
      if (!bVar9) goto LAB_002acd0a;
    }
    if (elem_01 == (long *)0x0) {
      return false;
    }
    Lib::Stack<void_*>::push(&this->_alternatives,elem_01);
    goto LAB_002acd3b;
  }
  if ((binding._content & 3) == 0) {
    iVar2 = *(int *)(binding._content + 8);
    pNVar5 = (Node *)0x0;
    pNVar3 = (Node *)0x0;
    for (; pNVar4 = (Node *)elem_00->_content, pNVar4 != (Node *)0x0; elem_00 = elem_00 + 1) {
      uVar1 = (pNVar4->_term)._content;
      if ((uVar1 & 3) != 0) {
        pTVar6 = elem_00;
        if (pNVar5 == (Node *)0x0) goto LAB_002acd59;
        goto LAB_002accaa;
      }
      if (pNVar3 == (Node *)0x0) {
        if (*(int *)(uVar1 + 8) == iVar2) {
          *curr = pNVar4;
          pNVar3 = pNVar4;
          pNVar5 = pNVar4;
        }
        else {
          pNVar3 = (Node *)0x0;
        }
      }
    }
    if (pNVar5 != (Node *)0x0) goto LAB_002accaa;
LAB_002acc77:
    if (pNVar4 == (Node *)0x0) {
      return false;
    }
  }
  else {
    while( true ) {
      pNVar4 = (Node *)elem_00->_content;
      if (pNVar4 == (Node *)0x0) {
        return false;
      }
      if (((pNVar4->_term)._content & 3) != 0) break;
      elem_00 = elem_00 + 1;
    }
  }
  *curr = pNVar4;
  do {
    elem_00 = elem_00 + 1;
    if (elem_00->_content == 0) break;
  } while ((*(byte *)(elem_00->_content + 8) & 3) == 0);
  goto LAB_002accaa;
  while ((uVar1 = (pNVar3->_term)._content, (uVar1 & 3) != 0 || (*(int *)(uVar1 + 8) != iVar2))) {
LAB_002acd59:
    pTVar6 = pTVar6 + 1;
    pNVar3 = (Node *)pTVar6->_content;
    if (pNVar3 == (Node *)0x0) goto LAB_002acc77;
  }
  *curr = pNVar3;
LAB_002accaa:
  Lib::Stack<unsigned_int>::push(&this->_specVarNumbers,uVar8);
  if (elem_00->_content == 0) {
    return false;
  }
  Lib::Stack<void_*>::push(&this->_alternatives,elem_00);
  elem = UNSORTED_LIST;
LAB_002acd3b:
  Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::push
            (&this->_nodeTypes,elem);
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::enterNode(Node*& curr)
{
  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList binding = _subst.getSpecVarBinding(inode->childVar);
  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    if(binding.isTerm()) {
      unsigned bindingFunctor=binding.term()->functor();
      //let's first skip proper term nodes at the beginning...
      while(*nl && (*nl)->term().isTerm()) {
        //...and have the one that interests us, if we encounter it.
        if(!curr && (*nl)->term().term()->functor()==bindingFunctor) {
          curr=*nl;
        }
        nl++;
      }
      if(!curr && *nl) {
        //we've encountered a variable node, but we still have to check, whether
        //the one proper term node, that interests us, isn't here
        Node** nl2=nl+1;
        while(*nl2) {
          if((*nl2)->term().isTerm() && (*nl2)->term().term()->functor()==bindingFunctor) {
            curr=*nl2;
            break;
          }
          nl2++;
        }
      }
    } else {
      //let's first skip proper term nodes at the beginning
      while(*nl && (*nl)->term().isTerm()) {
        nl++;
      }
    }
    if(!curr && *nl) {
      curr=*(nl++);
      while(*nl && (*nl)->term().isTerm()) {
	nl++;
      }
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    if(binding.isTerm()) {
      Node** byTop=inode->childByTop(binding.top(), false);
      if(byTop) {
	curr=*byTop;
      }
    }
    if(!curr && nl->head()->term().isVar()) {
      curr=nl->head();
      nl=nl->tail();
    }
    //in SkipList nodes variables are only at the beginning
    //(so if there aren't any, there aren't any at all)
    if(nl && nl->head()->term().isTerm()) {
      nl=0;
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}